

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

_Bool verifyconnect(curl_socket_t sockfd,int *error)

{
  int iVar1;
  int *piVar2;
  socklen_t local_24;
  int local_20;
  curl_socklen_t errSize;
  int err;
  _Bool rc;
  int *error_local;
  curl_socket_t sockfd_local;
  
  errSize._3_1_ = 1;
  local_20 = 0;
  local_24 = 4;
  _err = error;
  error_local._4_4_ = sockfd;
  iVar1 = getsockopt(sockfd,1,4,&local_20,&local_24);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    local_20 = *piVar2;
  }
  if ((local_20 == 0) || (local_20 == 0x6a)) {
    errSize._3_1_ = true;
  }
  else {
    errSize._3_1_ = false;
  }
  if (_err != (int *)0x0) {
    *_err = local_20;
  }
  return (_Bool)errSize._3_1_;
}

Assistant:

static bool verifyconnect(curl_socket_t sockfd, int *error)
{
  bool rc = TRUE;
#ifdef SO_ERROR
  int err = 0;
  curl_socklen_t errSize = sizeof(err);

#ifdef WIN32
  /*
   * In October 2003 we effectively nullified this function on Windows due to
   * problems with it using all CPU in multi-threaded cases.
   *
   * In May 2004, we bring it back to offer more info back on connect failures.
   * Gisle Vanem could reproduce the former problems with this function, but
   * could avoid them by adding this SleepEx() call below:
   *
   *    "I don't have Rational Quantify, but the hint from his post was
   *    ntdll::NtRemoveIoCompletion(). So I'd assume the SleepEx (or maybe
   *    just Sleep(0) would be enough?) would release whatever
   *    mutex/critical-section the ntdll call is waiting on.
   *
   *    Someone got to verify this on Win-NT 4.0, 2000."
   */

#ifdef _WIN32_WCE
  Sleep(0);
#else
  SleepEx(0, FALSE);
#endif

#endif

  if(0 != getsockopt(sockfd, SOL_SOCKET, SO_ERROR, (void *)&err, &errSize))
    err = SOCKERRNO;
#ifdef _WIN32_WCE
  /* Old WinCE versions don't support SO_ERROR */
  if(WSAENOPROTOOPT == err) {
    SET_SOCKERRNO(0);
    err = 0;
  }
#endif
#ifdef __minix
  /* Minix 3.1.x doesn't support getsockopt on UDP sockets */
  if(EBADIOCTL == err) {
    SET_SOCKERRNO(0);
    err = 0;
  }
#endif
  if((0 == err) || (EISCONN == err))
    /* we are connected, awesome! */
    rc = TRUE;
  else
    /* This wasn't a successful connect */
    rc = FALSE;
  if(error)
    *error = err;
#else
  (void)sockfd;
  if(error)
    *error = SOCKERRNO;
#endif
  return rc;
}